

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_string_rec(rf_font font,char *text,int text_len,rf_rec rec,float font_size,
                       float spacing,rf_text_wrap_mode wrap,rf_color tint)

{
  rf_glyph_info *prVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  rf_rec dest_rec;
  ulong local_118;
  int local_108;
  float local_c8;
  float local_88;
  float fStack_84;
  rf_decoded_rune local_48;
  
  fVar24 = font_size / (float)font.base_size;
  bVar22 = wrap != RF_WORD_WRAP;
  lVar13 = (long)text_len;
  uVar16 = 0;
  uVar14 = font.glyphs_count;
  if (font.glyphs_count < 1) {
    uVar14 = uVar16;
  }
  iVar6 = (int)((float)(font.base_size / 2 + font.base_size) * fVar24);
  iVar9 = 0;
  if (wrap == RF_CHAR_WRAP) {
    iVar9 = iVar6;
  }
  iVar20 = 0;
  iVar7 = 0;
  local_108 = -1;
  local_118 = 0xffffffffffffffff;
  do {
    if (lVar13 - uVar16 == 0 || lVar13 < (long)uVar16) {
      return;
    }
    rf_decode_utf8_char(&local_48,text + uVar16,lVar13 - uVar16);
    lVar19 = 0;
    uVar8 = uVar14;
    piVar11 = &(font.glyphs)->codepoint;
    while (bVar21 = uVar8 != 0, uVar8 = uVar8 - 1, bVar21) {
      if (*piVar11 == local_48.codepoint) {
        lVar19 = lVar19 >> 0x20;
        goto LAB_00149ca1;
      }
      lVar19 = lVar19 + 0x100000000;
      piVar11 = piVar11 + 8;
    }
    lVar19 = -1;
LAB_00149ca1:
    local_c8 = rec.width;
    if (local_48.codepoint == 0x3f) {
      lVar12 = 1;
      uVar8 = uVar16;
LAB_00149cf8:
      prVar1 = font.glyphs + lVar19;
      if (font.glyphs[lVar19].advance_x == 0) {
        fVar23 = (prVar1->field_0).rec.width;
      }
      else {
        fVar23 = (float)font.glyphs[lVar19].advance_x;
      }
      iVar17 = (int)(fVar23 * fVar24 + spacing);
      if (bVar22) {
        if ((wrap == RF_CHAR_WRAP) && (local_c8 <= (float)(iVar20 + iVar17 + 1))) {
          iVar7 = iVar7 + iVar6;
          iVar20 = 0;
        }
        if (rec.height < (float)((int)((float)font.base_size * fVar24) + iVar7)) {
          return;
        }
        if ((local_48.codepoint != 9) && (local_48.codepoint != 0x20)) {
          local_88 = rec.x;
          fStack_84 = rec.y;
          uVar2 = prVar1->offset_x;
          uVar4 = prVar1->offset_y;
          dest_rec.x = (float)(int)uVar2 * fVar24 + (float)iVar20 + local_88;
          dest_rec.y = (float)(int)uVar4 * fVar24 + (float)iVar7 + fStack_84;
          uVar3 = *(undefined8 *)((long)&prVar1->field_0 + 8);
          dest_rec.width = fVar24 * (float)uVar3;
          dest_rec.height = fVar24 * (float)((ulong)uVar3 >> 0x20);
          rf_draw_texture_region(font.texture,(prVar1->field_0).rec,dest_rec,(rf_vec2)0x0,0.0,tint);
        }
        goto LAB_00149e07;
      }
      bVar22 = false;
      uVar15 = uVar8;
      bVar21 = false;
      if ((local_48.codepoint < 0x21) &&
         (bVar21 = bVar22, (0x100000600U >> ((ulong)local_48.codepoint & 0x3f) & 1) != 0)) {
LAB_00149e65:
        local_118 = uVar8 & 0xffffffff;
        uVar15 = uVar8;
        bVar21 = bVar22;
      }
      uVar8 = (ulong)local_108;
      if (local_c8 <= (float)(iVar20 + 1 + iVar17)) {
        iVar20 = (int)local_118;
        if (iVar20 < 1) {
          iVar20 = (int)uVar15;
        }
        lVar19 = 0;
        if (uVar15 == (long)iVar20) {
          lVar19 = lVar12;
        }
        uVar18 = iVar20 - (int)lVar19;
        if (lVar12 + uVar8 == (long)(int)uVar18) {
          uVar18 = (int)uVar16 - 1;
        }
        uVar5 = (ulong)uVar18;
LAB_00149ec2:
        local_118 = uVar5;
        bVar22 = true;
        goto LAB_00149ecd;
      }
      uVar5 = uVar15;
      if ((lVar12 + uVar16 == lVar13) || (uVar5 = local_118, bVar21)) goto LAB_00149ec2;
      bVar22 = false;
    }
    else {
      uVar8 = (uVar16 + local_48.bytes_processed) - 1;
      lVar12 = local_48.bytes_processed;
      if (local_48.codepoint != 10) goto LAB_00149cf8;
      if (!bVar22) {
        bVar22 = true;
        iVar17 = 0;
        goto LAB_00149e65;
      }
      iVar7 = iVar7 + iVar9;
      if (wrap == RF_CHAR_WRAP) {
        iVar20 = 0;
      }
      iVar17 = 0;
LAB_00149e07:
      if ((wrap == RF_CHAR_WRAP) || (iVar10 = (int)local_118, uVar8 != (long)iVar10)) {
        bVar22 = true;
        uVar15 = uVar8;
      }
      else {
        iVar7 = iVar7 + iVar6;
        bVar22 = false;
        local_118 = 0xffffffffffffffff;
        local_108 = iVar10;
LAB_00149ecd:
        iVar17 = 0;
        iVar20 = 0;
        uVar15 = uVar8;
      }
    }
    iVar20 = iVar17 + iVar20;
    uVar16 = uVar15 + 1;
  } while( true );
}

Assistant:

RF_API void rf_draw_string_rec(rf_font font, const char* text, int text_len, rf_rec rec, float font_size, float spacing, rf_text_wrap_mode wrap, rf_color tint)
{
    int   text_offset_x = 0; // Offset between characters
    int   text_offset_y = 0; // Required for line break!
    float scale_factor  = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size/font.base_size;

    enum
    {
        MEASURE_WORD_WRAP_STATE = 0,
        MEASURE_RESULT_STATE = 1
    };

    int state      = wrap == RF_WORD_WRAP ? MEASURE_WORD_WRAP_STATE : MEASURE_RESULT_STATE;
    int start_line = -1; // Index where to begin drawing (where a line begins)
    int end_line   = -1; // Index where to stop drawing (where a line ends)
    int lastk      = -1; // Holds last value of the character position

    for (rf_int i = 0, k = 0; i < text_len; i++, k++)
    {
        int glyph_width = 0;

        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index  = rf_get_glyph_index(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += decoded_rune.bytes_processed - 1;

        if (letter != '\n')
        {
            glyph_width = (font.glyphs[index].advance_x == 0)?
                          (int)(font.glyphs[index].width*scale_factor + spacing):
                          (int)(font.glyphs[index].advance_x*scale_factor + spacing);
        }

        // NOTE: When wrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in start_line and end_line, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_WORD_WRAP_STATE)
        {
            // TODO: there are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // See: http://jkorpela.fi/chars/spaces.html
            if ((letter == ' ') || (letter == '\t') || (letter == '\n')) end_line = i;

            if ((text_offset_x + glyph_width + 1) >= rec.width)
            {
                end_line = (end_line < 1)? i : end_line;
                if (i == end_line) end_line -= decoded_rune.bytes_processed;
                if ((start_line + decoded_rune.bytes_processed) == end_line) end_line = i - decoded_rune.bytes_processed;
                state = !state;
            }
            else if ((i + 1) == text_len)
            {
                end_line = i;
                state = !state;
            }
            else if (letter == '\n')
            {
                state = !state;
            }

            if (state == MEASURE_RESULT_STATE)
            {
                text_offset_x = 0;
                i = start_line;
                glyph_width = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (letter == '\n')
            {
                if (!wrap)
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }
            }
            else
            {
                if (!wrap && ((text_offset_x + glyph_width + 1) >= rec.width))
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }

                if ((text_offset_y + (int)(font.base_size*scale_factor)) > rec.height) break;

                // Draw glyph
                if ((letter != ' ') && (letter != '\t'))
                {
                    rf_draw_texture_region(font.texture, font.glyphs[index].rec,
                                           (rf_rec) {
                                               rec.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                               rec.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                               font.glyphs[index].width  * scale_factor,
                                               font.glyphs[index].height * scale_factor
                                           },
                                           (rf_vec2){ 0, 0 }, 0.0f, tint);
                }
            }

            if (wrap && (i == end_line))
            {
                text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                text_offset_x = 0;
                start_line = end_line;
                end_line = -1;
                glyph_width = 0;
                k = lastk;
                state = !state;
            }
        }

        text_offset_x += glyph_width;
    }
}